

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_bool tcd_t2_decode(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                      OPJ_UINT32 p_max_src_size,opj_codestream_index_t *p_cstr_index)

{
  opj_bool oVar1;
  opj_t2_v2_t *poVar2;
  opj_t2_v2_t *l_t2;
  OPJ_BYTE *in_stack_00000040;
  opj_tcd_tile_v2 *in_stack_00000048;
  OPJ_UINT32 in_stack_00000054;
  opj_t2_v2_t *in_stack_00000058;
  opj_codestream_index_t *in_stack_00000070;
  opj_cp_v2_t *in_stack_ffffffffffffffc0;
  opj_image_t *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  poVar2 = t2_create_v2(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (poVar2 == (opj_t2_v2_t *)0x0) {
    local_4 = 0;
  }
  else {
    oVar1 = t2_decode_packets_v2
                      (in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040,
                       (OPJ_UINT32 *)p_tcd,p_src_data._4_4_,in_stack_00000070);
    if (oVar1 == 0) {
      t2_destroy_v2((opj_t2_v2_t *)0x2ce60f);
      local_4 = 0;
    }
    else {
      t2_destroy_v2((opj_t2_v2_t *)0x2ce623);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

opj_bool tcd_t2_decode (
					opj_tcd_v2_t *p_tcd,
					OPJ_BYTE * p_src_data,
					OPJ_UINT32 * p_data_read,
					OPJ_UINT32 p_max_src_size,
					opj_codestream_index_t *p_cstr_index
					)
{
	opj_t2_v2_t * l_t2;

	l_t2 = t2_create_v2(p_tcd->image, p_tcd->cp);
	if (l_t2 == 00) {
		return OPJ_FALSE;
	}

	if (! t2_decode_packets_v2(
					l_t2,
					p_tcd->tcd_tileno,
					p_tcd->tcd_image->tiles,
					p_src_data,
					p_data_read,
					p_max_src_size,
					p_cstr_index)) {
		t2_destroy_v2(l_t2);
		return OPJ_FALSE;
	}

	t2_destroy_v2(l_t2);

	/*---------------CLEAN-------------------*/
	return OPJ_TRUE;
}